

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep *
sqlite3TriggerInsertStep
          (sqlite3 *db,Token *pTableName,IdList *pColumn,ExprList *pEList,Select *pSelect,u8 orconf)

{
  TriggerStep *pTVar1;
  Select *pSVar2;
  ExprList *pEVar3;
  TriggerStep *pTriggerStep;
  u8 orconf_local;
  Select *pSelect_local;
  ExprList *pEList_local;
  IdList *pColumn_local;
  Token *pTableName_local;
  sqlite3 *db_local;
  
  pTVar1 = triggerStepAllocate(db,'i',pTableName);
  if (pTVar1 == (TriggerStep *)0x0) {
    sqlite3IdListDelete(db,pColumn);
  }
  else {
    pSVar2 = sqlite3SelectDup(db,pSelect,1);
    pTVar1->pSelect = pSVar2;
    pTVar1->pIdList = pColumn;
    pEVar3 = sqlite3ExprListDup(db,pEList,1);
    pTVar1->pExprList = pEVar3;
    pTVar1->orconf = orconf;
  }
  sqlite3ExprListDelete(db,pEList);
  sqlite3SelectDelete(db,pSelect);
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerInsertStep(
  sqlite3 *db,        /* The database connection */
  Token *pTableName,  /* Name of the table into which we insert */
  IdList *pColumn,    /* List of columns in pTableName to insert into */
  ExprList *pEList,   /* The VALUE clause: a list of values to be inserted */
  Select *pSelect,    /* A SELECT statement that supplies values */
  u8 orconf           /* The conflict algorithm (OE_Abort, OE_Replace, etc.) */
){
  TriggerStep *pTriggerStep;

  assert(pEList == 0 || pSelect == 0);
  assert(pEList != 0 || pSelect != 0 || db->mallocFailed);

  pTriggerStep = triggerStepAllocate(db, TK_INSERT, pTableName);
  if( pTriggerStep ){
    pTriggerStep->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
    pTriggerStep->pIdList = pColumn;
    pTriggerStep->pExprList = sqlite3ExprListDup(db, pEList, EXPRDUP_REDUCE);
    pTriggerStep->orconf = orconf;
  }else{
    sqlite3IdListDelete(db, pColumn);
  }
  sqlite3ExprListDelete(db, pEList);
  sqlite3SelectDelete(db, pSelect);

  return pTriggerStep;
}